

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::optional<pbrt::ShapeSample>::optional
          (optional<pbrt::ShapeSample> *this,optional<pbrt::ShapeSample> *v)

{
  bool bVar1;
  Interval<float> IVar2;
  Interval<float> IVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ShapeSample *pSVar9;
  
  bVar1 = v->set;
  this->set = bVar1;
  if (bVar1 == true) {
    pSVar9 = value(v);
    IVar2 = (pSVar9->intr).pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
    IVar3 = (pSVar9->intr).pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    uVar4 = *(undefined8 *)&(pSVar9->intr).time;
    uVar5 = *(undefined8 *)&(pSVar9->intr).wo.super_Tuple3<pbrt::Vector3,_float>.y;
    uVar6 = *(undefined8 *)&(pSVar9->intr).n.super_Tuple3<pbrt::Normal3,_float>;
    uVar7 = *(undefined8 *)&(pSVar9->intr).n.super_Tuple3<pbrt::Normal3,_float>.z;
    uVar8 = *(undefined8 *)&(pSVar9->intr).uv.super_Tuple2<pbrt::Point2,_float>.y;
    (this->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)
         (pSVar9->intr).pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
    *(Interval<float> *)((long)&this->optionalValue + 8) = IVar2;
    *(Interval<float> *)((long)&this->optionalValue + 0x10) = IVar3;
    *(undefined8 *)((long)&this->optionalValue + 0x18) = uVar4;
    *(undefined8 *)((long)&this->optionalValue + 0x20) = uVar5;
    *(undefined8 *)((long)&this->optionalValue + 0x28) = uVar6;
    *(undefined8 *)((long)&this->optionalValue + 0x30) = uVar7;
    *(undefined8 *)((long)&this->optionalValue + 0x38) = uVar8;
    *(MediumInterface **)((long)&this->optionalValue + 0x40) = (pSVar9->intr).mediumInterface;
    *(undefined8 *)((long)&this->optionalValue + 0x48) = 0;
    *(uintptr_t *)((long)&this->optionalValue + 0x48) =
         (pSVar9->intr).medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    *(Float *)((long)&this->optionalValue + 0x50) = pSVar9->pdf;
    reset(v);
    return;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }